

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O0

void __thiscall
test_vector_dense_vector_subtraction_Test::TestBody(test_vector_dense_vector_subtraction_Test *this)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  iterator pvVar5;
  char *pcVar6;
  char *regex;
  char *regex_00;
  char *regex_01;
  char *regex_02;
  type tVar7;
  AssertHelper local_4b0;
  Message local_4a8 [6];
  exception *gtest_exception_3;
  ReturnSentinel local_460;
  ReturnSentinel gtest_sentinel_3;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_3;
  pointer local_438;
  DeathTest *gtest_dt_3;
  Message local_428 [6];
  exception *gtest_exception_2;
  double local_3f0;
  ReturnSentinel local_3e8;
  ReturnSentinel gtest_sentinel_2;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_2;
  pointer local_3c0;
  DeathTest *gtest_dt_2;
  Message local_3b0 [6];
  exception *gtest_exception_1;
  ReturnSentinel local_368;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_340;
  DeathTest *gtest_dt_1;
  Message local_330;
  int local_324;
  exception *gtest_exception;
  ReturnSentinel local_2e0;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_2b8;
  DeathTest *gtest_dt;
  Vector_Dense<double,_2UL> static_vector_2;
  Vector_Dense<double,_0UL> dynamic_vector_2;
  Message local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_3;
  value_type_conflict *element_3;
  iterator __end1_3;
  iterator __begin1_3;
  Vector_Dense<double,_3UL> *__range1_3;
  Message local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_2;
  value_type_conflict *element_2;
  iterator __end1_2;
  iterator __begin1_2;
  Vector_Dense<double,_3UL> *__range1_2;
  Message local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  value_type_conflict *element_1;
  iterator __end1_1;
  iterator __begin1_1;
  Vector_Dense<double,_3UL> *__range1_1;
  Message local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar;
  double *element;
  iterator __end1;
  iterator __begin1;
  Vector_Dense<double,_0UL> *__range1;
  Vector_Dense<double,_3UL> result_3;
  Vector_Dense<double,_3UL> result_2;
  Vector_Dense<double,_3UL> result_1;
  Vector_Dense<double,_0UL> result_0;
  initializer_list<double> local_110;
  undefined1 local_100 [8];
  Vector_Dense<double,_3UL> static_vector_1;
  initializer_list<double> local_d0;
  undefined1 local_c0 [8];
  Vector_Dense<double,_3UL> static_vector_0;
  double local_98 [3];
  initializer_list<double> local_80;
  undefined1 local_70 [8];
  Vector_Dense<double,_0UL> dynamic_vector_1;
  initializer_list<double> local_38;
  undefined1 local_28 [8];
  Vector_Dense<double,_0UL> dynamic_vector_0;
  test_vector_dense_vector_subtraction_Test *this_local;
  
  dynamic_vector_1.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xbff0000000000000;
  local_38._M_array =
       (iterator)
       &dynamic_vector_1.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  local_38._M_len = 3;
  dynamic_vector_0.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)local_28,&local_38);
  local_98[2] = -3.0;
  local_98[0] = -1.0;
  local_98[1] = -2.0;
  local_80._M_array = local_98;
  local_80._M_len = 3;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)local_70,&local_80);
  static_vector_1.super_array<double,_3UL>._M_elems[2] = -4.0;
  local_d0._M_array = static_vector_1.super_array<double,_3UL>._M_elems + 2;
  local_d0._M_len = 3;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense((Vector_Dense<double,_3UL> *)local_c0,&local_d0);
  result_0.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xc010000000000000;
  local_110._M_array =
       (iterator)
       &result_0.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  local_110._M_len = 3;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense((Vector_Dense<double,_3UL> *)local_100,&local_110);
  Disa::operator-((type *)(result_1.super_array<double,_3UL>._M_elems + 2),
                  (Vector_Dense<double,_0UL> *)local_28,(Vector_Dense<double,_0UL> *)local_70);
  Disa::operator-((type *)(result_2.super_array<double,_3UL>._M_elems + 2),
                  (Vector_Dense<double,_3UL> *)local_c0,(Vector_Dense<double,_0UL> *)local_70);
  Disa::operator-((type *)(result_3.super_array<double,_3UL>._M_elems + 2),
                  (Vector_Dense<double,_0UL> *)local_28,(Vector_Dense<double,_3UL> *)local_100);
  Disa::operator-((type *)&__range1,(Vector_Dense<double,_3UL> *)local_c0,
                  (Vector_Dense<double,_3UL> *)local_100);
  pdVar1 = result_1.super_array<double,_3UL>._M_elems + 2;
  __end1 = std::vector<double,_std::allocator<double>_>::begin(pdVar1);
  element = (double *)
            std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)pdVar1);
  while (bVar2 = __gnu_cxx::operator==<double_*,_std::vector<double,_std::allocator<double>_>_>
                           (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                     *)&element), ((bVar2 ^ 0xffU) & 1) != 0) {
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(&__end1);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_1b8,"element","0.0",
               *(double *)
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,0.0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
    if (!bVar2) {
      testing::Message::Message(&local_1c0);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&__range1_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd5,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&__range1_1,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1_1);
      testing::Message::~Message(&local_1c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  pdVar1 = result_2.super_array<double,_3UL>._M_elems + 2;
  __end1_1 = std::array<double,_3UL>::begin((array<double,_3UL> *)pdVar1);
  pvVar5 = std::array<double,_3UL>::end((array<double,_3UL> *)pdVar1);
  for (; __end1_1 != pvVar5; __end1_1 = __end1_1 + 1) {
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__end1_1;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_1f8,"element","-3.0",*__end1_1,-3.0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
    if (!bVar2) {
      testing::Message::Message(&local_200);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&__range1_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd6,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&__range1_2,&local_200);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1_2);
      testing::Message::~Message(&local_200);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  }
  pdVar1 = result_3.super_array<double,_3UL>._M_elems + 2;
  __end1_2 = std::array<double,_3UL>::begin((array<double,_3UL> *)pdVar1);
  pvVar5 = std::array<double,_3UL>::end((array<double,_3UL> *)pdVar1);
  for (; __end1_2 != pvVar5; __end1_2 = __end1_2 + 1) {
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__end1_2;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_238,"element","3.0",*__end1_2,3.0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar2) {
      testing::Message::Message(&local_240);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&__range1_3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd7,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&__range1_3,&local_240);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1_3);
      testing::Message::~Message(&local_240);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  }
  __end1_3 = std::array<double,_3UL>::begin((array<double,_3UL> *)&__range1);
  pvVar5 = std::array<double,_3UL>::end((array<double,_3UL> *)&__range1);
  for (; __end1_3 != pvVar5; __end1_3 = __end1_3 + 1) {
    gtest_ar_3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__end1_3;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_278,"element","0.0",*__end1_3,0.0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
    if (!bVar2) {
      testing::Message::Message(&local_280);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd8,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_280);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_280);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  }
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)(static_vector_2.super_array<double,_2UL>._M_elems + 1));
  Disa::Vector_Dense<double,_2UL>::Vector_Dense((Vector_Dense<double,_2UL> *)&gtest_dt);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar2 = testing::internal::DeathTest::Create
                      ("dynamic_vector_0 - dynamic_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xdc,&local_2b8);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00117e95;
    if (local_2b8 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_2b8);
      iVar3 = (*local_2b8->_vptr_DeathTest[2])();
      if (iVar3 == 0) {
        iVar3 = (*local_2b8->_vptr_DeathTest[3])();
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        uVar4 = (*local_2b8->_vptr_DeathTest[4])(local_2b8,(ulong)bVar2);
        if ((uVar4 & 1) != 0) goto LAB_00117e57;
        local_324 = 10;
      }
      else {
        if (iVar3 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_2e0,local_2b8);
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            Disa::operator-((type *)&gtest_exception,(Vector_Dense<double,_0UL> *)local_28,
                            (Vector_Dense<double,_0UL> *)
                            (static_vector_2.super_array<double,_2UL>._M_elems + 1));
            Disa::Vector_Dense<double,_0UL>::~Vector_Dense
                      ((Vector_Dense<double,_0UL> *)&gtest_exception);
          }
          (*local_2b8->_vptr_DeathTest[5])(local_2b8,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_2e0);
        }
LAB_00117e57:
        local_324 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_324 != 0) goto LAB_00117e95;
    }
  }
  else {
LAB_00117e95:
    testing::Message::Message(&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xdc,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_1,&local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_1);
    testing::Message::~Message(&local_330);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,(internal *)"./*",regex_00);
    bVar2 = testing::internal::DeathTest::Create
                      ("static_vector_0 - dynamic_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xdd,&local_340);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_0011830f;
    if (local_340 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_340);
      iVar3 = (*local_340->_vptr_DeathTest[2])();
      if (iVar3 == 0) {
        iVar3 = (*local_340->_vptr_DeathTest[3])();
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        uVar4 = (*local_340->_vptr_DeathTest[4])(local_340,(ulong)bVar2);
        if ((uVar4 & 1) != 0) goto LAB_001182d1;
        local_324 = 0xc;
      }
      else {
        if (iVar3 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_368,local_340);
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            Disa::operator-((type *)&gtest_exception_1,(Vector_Dense<double,_3UL> *)local_c0,
                            (Vector_Dense<double,_0UL> *)
                            (static_vector_2.super_array<double,_2UL>._M_elems + 1));
          }
          (*local_340->_vptr_DeathTest[5])(local_340,2);
          local_324 = 0xd;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_368);
        }
LAB_001182d1:
        local_324 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_324 != 0) goto LAB_0011830f;
    }
  }
  else {
LAB_0011830f:
    testing::Message::Message(local_3b0);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xdd,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_2,local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_2);
    testing::Message::~Message(local_3b0);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2,(internal *)"./*",regex_01);
    bVar2 = testing::internal::DeathTest::Create
                      ("dynamic_vector_0 - static_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xde,&local_3c0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2);
    if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_001187af;
    if (local_3c0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_2,local_3c0);
      iVar3 = (*local_3c0->_vptr_DeathTest[2])();
      if (iVar3 == 0) {
        iVar3 = (*local_3c0->_vptr_DeathTest[3])();
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        uVar4 = (*local_3c0->_vptr_DeathTest[4])(local_3c0,(ulong)bVar2);
        if ((uVar4 & 1) != 0) goto LAB_00118771;
        local_324 = 0xe;
      }
      else {
        if (iVar3 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_3e8,local_3c0);
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            tVar7 = Disa::operator-((Vector_Dense<double,_0UL> *)local_28,
                                    (Vector_Dense<double,_2UL> *)&gtest_dt);
            local_3f0 = tVar7.super_array<double,_2UL>._M_elems[1];
            gtest_exception_2 = tVar7.super_array<double,_2UL>._M_elems[0];
          }
          (*local_3c0->_vptr_DeathTest[5])(local_3c0,2);
          local_324 = 0xf;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_3e8);
        }
LAB_00118771:
        local_324 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_2);
      if (local_324 != 0) goto LAB_001187af;
    }
  }
  else {
LAB_001187af:
    testing::Message::Message(local_428);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xde,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_3,local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_3);
    testing::Message::~Message(local_428);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3,(internal *)"./*",regex_02);
    bVar2 = testing::internal::DeathTest::Create
                      ("static_vector_0 - static_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xdf,&local_438);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      if (local_438 == (pointer)0x0) goto LAB_00118cda;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_3,local_438);
      iVar3 = (*local_438->_vptr_DeathTest[2])();
      if (iVar3 == 0) {
        iVar3 = (*local_438->_vptr_DeathTest[3])();
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        uVar4 = (*local_438->_vptr_DeathTest[4])(local_438,(ulong)bVar2);
        if ((uVar4 & 1) != 0) goto LAB_00118beb;
        local_324 = 0x10;
      }
      else {
        if (iVar3 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_460,local_438);
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            Disa::operator-((type *)&gtest_exception_3,(Vector_Dense<double,_3UL> *)local_c0,
                            (Vector_Dense<double,_2UL> *)&gtest_dt);
          }
          (*local_438->_vptr_DeathTest[5])(local_438,2);
          local_324 = 0x11;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_460);
        }
LAB_00118beb:
        local_324 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_3);
      if (local_324 == 0) goto LAB_00118cda;
    }
  }
  testing::Message::Message(local_4a8);
  pcVar6 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_4b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
             ,0xdf,pcVar6);
  testing::internal::AssertHelper::operator=(&local_4b0,local_4a8);
  testing::internal::AssertHelper::~AssertHelper(&local_4b0);
  testing::Message::~Message(local_4a8);
LAB_00118cda:
  Disa::Vector_Dense<double,_0UL>::~Vector_Dense
            ((Vector_Dense<double,_0UL> *)(static_vector_2.super_array<double,_2UL>._M_elems + 1));
  Disa::Vector_Dense<double,_0UL>::~Vector_Dense
            ((Vector_Dense<double,_0UL> *)(result_1.super_array<double,_3UL>._M_elems + 2));
  Disa::Vector_Dense<double,_0UL>::~Vector_Dense((Vector_Dense<double,_0UL> *)local_70);
  Disa::Vector_Dense<double,_0UL>::~Vector_Dense((Vector_Dense<double,_0UL> *)local_28);
  return;
}

Assistant:

TEST(test_vector_dense, vector_subtraction) {
  Vector_Dense<Scalar, 0> dynamic_vector_0 = {-1.0, -2.0, -3.0};
  Vector_Dense<Scalar, 0> dynamic_vector_1 = {-1.0, -2.0, -3.0};
  Vector_Dense<Scalar, 3> static_vector_0 = {-4.0, -5.0, -6.0};
  Vector_Dense<Scalar, 3> static_vector_1 = {-4.0, -5.0, -6.0};

  Vector_Dense<Scalar, 0> result_0 = dynamic_vector_0 - dynamic_vector_1;
  Vector_Dense<Scalar, 3> result_1 = static_vector_0 - dynamic_vector_1;
  Vector_Dense<Scalar, 3> result_2 = dynamic_vector_0 - static_vector_1;
  Vector_Dense<Scalar, 3> result_3 = static_vector_0 - static_vector_1;
  FOR_EACH(element, result_0) EXPECT_DOUBLE_EQ(element, 0.0);
  FOR_EACH(element, result_1) EXPECT_DOUBLE_EQ(element, -3.0);
  FOR_EACH(element, result_2) EXPECT_DOUBLE_EQ(element, 3.0);
  FOR_EACH(element, result_3) EXPECT_DOUBLE_EQ(element, 0.0);

  Vector_Dense<Scalar, 0> dynamic_vector_2;
  Vector_Dense<Scalar, 2> static_vector_2;
  EXPECT_DEATH(dynamic_vector_0 - dynamic_vector_2, "./*");
  EXPECT_DEATH(static_vector_0 - dynamic_vector_2, "./*");
  EXPECT_DEATH(dynamic_vector_0 - static_vector_2, "./*");
  EXPECT_DEATH(static_vector_0 - static_vector_2, "./*");
}